

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

int Gia_ManLutFaninCount(Gia_Man_t *p)

{
  int iVar1;
  int local_18;
  int local_14;
  int Counter;
  int i;
  Gia_Man_t *p_local;
  
  local_18 = 0;
  for (local_14 = 1; iVar1 = Gia_ManObjNum(p), local_14 < iVar1; local_14 = local_14 + 1) {
    iVar1 = Gia_ObjIsLut(p,local_14);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjLutSize(p,local_14);
      local_18 = iVar1 + local_18;
    }
  }
  return local_18;
}

Assistant:

int Gia_ManLutFaninCount( Gia_Man_t * p )
{
    int i, Counter = 0;
    Gia_ManForEachLut( p, i )
        Counter += Gia_ObjLutSize(p, i);
    return Counter;
}